

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-conversion-bignum.cpp
# Opt level: O1

void __thiscall icu_63::double_conversion::Bignum::AssignUInt16(Bignum *this,uint16_t value)

{
  uint *puVar1;
  long lVar2;
  
  if (0 < this->used_digits_) {
    puVar1 = (this->bigits_).start_;
    lVar2 = 0;
    do {
      puVar1[lVar2] = 0;
      lVar2 = lVar2 + 1;
    } while (lVar2 < this->used_digits_);
  }
  this->used_digits_ = 0;
  this->exponent_ = 0;
  if (value != 0) {
    *(this->bigits_).start_ = (uint)value;
    this->used_digits_ = 1;
  }
  return;
}

Assistant:

void Bignum::Zero() {
  for (int i = 0; i < used_digits_; ++i) {
    bigits_[i] = 0;
  }
  used_digits_ = 0;
  exponent_ = 0;
}